

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

AsmJsSymbol * __thiscall
Js::AsmJsModuleCompiler::LookupIdentifier
          (AsmJsModuleCompiler *this,PropertyName name,AsmJsFunc *func,Source *lookupSource)

{
  int iVar1;
  Type piVar2;
  DictionaryStats *pDVar3;
  uint uVar4;
  AsmJsSymbol *pAVar5;
  Type pSVar6;
  uint uVar7;
  
  if (name == (PropertyName)0x0) {
    return (AsmJsSymbol *)0x0;
  }
  if ((func != (AsmJsFunc *)0x0) &&
     (pAVar5 = AsmJsFunc::LookupIdentifier(func,name,lookupSource), pAVar5 != (AsmJsSymbol *)0x0)) {
    return pAVar5;
  }
  piVar2 = (this->mModuleEnvironment).buckets;
  uVar4 = 0;
  if (piVar2 != (Type)0x0) {
    iVar1 = name->m_propertyId;
    uVar4 = JsUtil::
            BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(iVar1 * 2 + 1,(this->mModuleEnvironment).bucketCount,
                        (this->mModuleEnvironment).modFunctionIndex);
    uVar7 = piVar2[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar7) {
      pSVar6 = (this->mModuleEnvironment).entries;
      uVar4 = 0;
      do {
        if (pSVar6[uVar7].
            super_DefaultHashedEntry<int,_Js::AsmJsSymbol_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_Js::AsmJsSymbol_*>.
            super_ValueEntry<Js::AsmJsSymbol_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsSymbol_*>_>
            .super_KeyValueEntryDataLayout2<int,_Js::AsmJsSymbol_*>.key == iVar1) {
          pDVar3 = (this->mModuleEnvironment).stats;
          if (pDVar3 != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pDVar3,uVar4);
            pSVar6 = (this->mModuleEnvironment).entries;
          }
          pAVar5 = pSVar6[uVar7].
                   super_DefaultHashedEntry<int,_Js::AsmJsSymbol_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<int,_Js::AsmJsSymbol_*>.
                   super_ValueEntry<Js::AsmJsSymbol_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsSymbol_*>_>
                   .super_KeyValueEntryDataLayout2<int,_Js::AsmJsSymbol_*>.value;
          goto LAB_009480e2;
        }
        uVar4 = uVar4 + 1;
        uVar7 = pSVar6[uVar7].
                super_DefaultHashedEntry<int,_Js::AsmJsSymbol_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<int,_Js::AsmJsSymbol_*>.
                super_ValueEntry<Js::AsmJsSymbol_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsSymbol_*>_>
                .super_KeyValueEntryDataLayout2<int,_Js::AsmJsSymbol_*>.next;
      } while (-1 < (int)uVar7);
    }
  }
  pDVar3 = (this->mModuleEnvironment).stats;
  if (pDVar3 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar3,uVar4);
  }
  pAVar5 = (AsmJsSymbol *)0x0;
LAB_009480e2:
  if (lookupSource != (Source *)0x0) {
    *lookupSource = AsmJsModule;
  }
  return pAVar5;
}

Assistant:

AsmJsSymbol* AsmJsModuleCompiler::LookupIdentifier(PropertyName name, AsmJsFunc* func /*= nullptr */, AsmJsLookupSource::Source* lookupSource /*= nullptr*/)
    {
        AsmJsSymbol* lookupResult = nullptr;
        if (name)
        {
            if (func)
            {
                lookupResult = func->LookupIdentifier(name, lookupSource);
                if (lookupResult)
                {
                    return lookupResult;
                }
            }

            lookupResult = mModuleEnvironment.LookupWithKey(name->GetPropertyId(), nullptr);
            if (lookupSource)
            {
                *lookupSource = AsmJsLookupSource::AsmJsModule;
            }
        }
        return lookupResult;
    }